

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O0

void tb_check_watchpoint_ppc64(CPUState *cpu,uintptr_t retaddr)

{
  uint32_t local_4c;
  tb_page_addr_t tStack_48;
  uint32_t flags;
  tb_page_addr_t addr;
  target_ulong cs_base;
  target_ulong pc;
  CPUArchState_conflict21 *env;
  TranslationBlock *tb;
  TCGContext_conflict10 *tcg_ctx;
  uintptr_t retaddr_local;
  CPUState *cpu_local;
  
  tb = (TranslationBlock *)cpu->uc->tcg_ctx;
  tcg_ctx = (TCGContext_conflict10 *)retaddr;
  retaddr_local = (uintptr_t)cpu;
  env = (CPUArchState_conflict21 *)tcg_tb_lookup_ppc64((TCGContext_conflict10 *)tb,retaddr);
  if (env == (CPUArchState_conflict21 *)0x0) {
    pc = *(undefined8 *)(retaddr_local + 0x128);
    cpu_get_tb_cpu_state((CPUPPCState_conflict2 *)pc,&cs_base,&addr,&local_4c);
    tStack_48 = get_page_addr_code_ppc64((CPUArchState_conflict21 *)pc,cs_base);
    if (tStack_48 != 0xffffffffffffffff) {
      tb_invalidate_phys_range_ppc64
                (*(uc_struct_conflict11 **)(retaddr_local + 0x81a8),tStack_48,tStack_48 + 1);
    }
  }
  else {
    cpu_restore_state_from_tb
              ((CPUState *)retaddr_local,(TranslationBlock *)env,(uintptr_t)tcg_ctx,true);
    tb_phys_invalidate_ppc64((TCGContext_conflict10 *)tb,(TranslationBlock *)env,0xffffffffffffffff)
    ;
  }
  return;
}

Assistant:

void tb_check_watchpoint(CPUState *cpu, uintptr_t retaddr)
{
    TCGContext *tcg_ctx = cpu->uc->tcg_ctx;
    TranslationBlock *tb;

    assert_memory_lock();

    tb = tcg_tb_lookup(tcg_ctx, retaddr);
    if (tb) {
        /* We can use retranslation to find the PC.  */
        cpu_restore_state_from_tb(cpu, tb, retaddr, true);
        tb_phys_invalidate(tcg_ctx, tb, -1);
    } else {
        /* The exception probably happened in a helper.  The CPU state should
           have been saved before calling it. Fetch the PC from there.  */
        CPUArchState *env = cpu->env_ptr;
        target_ulong pc, cs_base;
        tb_page_addr_t addr;
        uint32_t flags;

        cpu_get_tb_cpu_state(env, &pc, &cs_base, &flags);
        addr = get_page_addr_code(env, pc);
        if (addr != -1) {
            tb_invalidate_phys_range(cpu->uc, addr, addr + 1);
        }
    }
}